

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O2

void __thiscall
so_5::disp::reuse::work_thread::details::activity_tracking_impl_t::serve_demands_block
          (activity_tracking_impl_t *this,demand_container_t *demands)

{
  lock_t *this_00;
  activity_stats_t *value_to_update;
  demands_counter_t *pdVar1;
  execution_demand_t *peVar2;
  duration dVar3;
  lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_> lock;
  time_point activity_started_at;
  time_point local_30;
  
  local_30.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  this_00 = &this->m_stats_lock;
  spinlock_t<so_5::yield_backoff_t>::lock(this_00);
  this->m_activity_started_at = &local_30;
  (this->m_activity_stats).m_count = (this->m_activity_stats).m_count + 1;
  value_to_update = &this->m_activity_stats;
  (this->m_stats_lock).m_flag.super___atomic_flag_base._M_i = false;
  while (peVar2 = (demands->
                  super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>
                  )._M_impl.super__Deque_impl_data._M_start._M_cur,
        (demands->
        super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>).
        _M_impl.super__Deque_impl_data._M_finish._M_cur != peVar2) {
    (*peVar2->m_demand_handler)
              ((current_thread_id_t)
               (this->
               super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
               ).m_thread_id._M_thread,peVar2);
    dVar3.__r = std::chrono::_V2::steady_clock::now();
    std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::pop_front
              (demands);
    LOCK();
    pdVar1 = &(this->
              super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
              ).m_demands_count;
    (pdVar1->super___atomic_base<unsigned_long>)._M_i =
         (pdVar1->super___atomic_base<unsigned_long>)._M_i - 1;
    UNLOCK();
    spinlock_t<so_5::yield_backoff_t>::lock(this_00);
    stats::details::update_stats_from_duration
              (value_to_update,(duration)(dVar3.__r - (long)local_30.__d.__r));
    if ((demands->
        super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>).
        _M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (demands->
        super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>).
        _M_impl.super__Deque_impl_data._M_start._M_cur) {
      this->m_activity_started_at = (time_point *)0x0;
    }
    else {
      value_to_update->m_count = value_to_update->m_count + 1;
      local_30.__d.__r = (duration)(duration)dVar3.__r;
    }
    (this_00->m_flag).super___atomic_flag_base._M_i = false;
  }
  return;
}

Assistant:

void
	serve_demands_block(
		//! Bunch of demands to be processed.
		demand_container_t & demands )
	{
		auto activity_started_at = so_5::stats::clock_type_t::now();

		{
			std::lock_guard< activity_tracking_traits::lock_t > lock{ m_stats_lock };
			m_activity_started_at = &activity_started_at;
			m_activity_stats.m_count += 1;
		}

		while( !demands.empty() )
		{
			auto & demand = demands.front();

			demand.call_handler( m_thread_id );

			const auto activity_finished_at = so_5::stats::clock_type_t::now();

			demands.pop_front();
			--m_demands_count;

			{
				std::lock_guard< activity_tracking_traits::lock_t > lock{ m_stats_lock };
				so_5::stats::details::update_stats_from_duration(
						m_activity_stats,
						activity_finished_at - activity_started_at );

				if( demands.empty() )
					m_activity_started_at = nullptr;
				else
				{
					activity_started_at = activity_finished_at;
					m_activity_stats.m_count += 1;
				}
			}
		}
	}